

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::computeQuadTexCoord
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,TextureGather2DCase *this,
          int param_1)

{
  Vec2 local_20;
  Vec2 local_18;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18.m_data[0] = -0.3;
  local_18.m_data[1] = -0.4;
  local_20.m_data[0] = 1.5;
  local_20.m_data[1] = 1.6;
  glu::TextureTestUtil::computeQuadTexCoord2D(__return_storage_ptr__,&local_18,&local_20);
  return __return_storage_ptr__;
}

Assistant:

vector<float> TextureGather2DCase::computeQuadTexCoord (int /* iterationNdx */) const
{
	vector<float> res;
	glu::TextureTestUtil::computeQuadTexCoord2D(res, Vec2(-0.3f, -0.4f), Vec2(1.5f, 1.6f));
	return res;
}